

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  int iVar1;
  ushort uVar2;
  int local_4c;
  uint16_t run_start_1;
  int rlepos_1;
  bitset_container_t *answer;
  int iStack_34;
  uint16_t run_value;
  uint16_t run_end;
  uint16_t run_start;
  int rlepos;
  array_container_t *answer_1;
  uint8_t *resulttype_local;
  int32_t card_local;
  run_container_t *rc_local;
  
  if (card < 0x1001) {
    rc_local = (run_container_t *)array_container_create_given_capacity(card);
    ((array_container_t *)rc_local)->cardinality = 0;
    for (iStack_34 = 0; iStack_34 < rc->n_runs; iStack_34 = iStack_34 + 1) {
      answer._6_2_ = rc->runs[iStack_34].value;
      uVar2 = answer._6_2_ + rc->runs[iStack_34].length;
      for (; answer._6_2_ <= uVar2; answer._6_2_ = answer._6_2_ + 1) {
        iVar1 = ((array_container_t *)rc_local)->cardinality;
        ((array_container_t *)rc_local)->cardinality = iVar1 + 1;
        ((array_container_t *)rc_local)->array[iVar1] = answer._6_2_;
      }
    }
    if (card != ((array_container_t *)rc_local)->cardinality) {
      __assert_fail("card == answer->cardinality",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2de6,
                    "container_t *convert_to_bitset_or_array_container(run_container_t *, int32_t, uint8_t *)"
                   );
    }
    *resulttype = '\x02';
  }
  else {
    rc_local = (run_container_t *)bitset_container_create();
    for (local_4c = 0; local_4c < rc->n_runs; local_4c = local_4c + 1) {
      bitset_set_lenrange((uint64_t *)rc_local->runs,(uint)rc->runs[local_4c].value,
                          (uint)rc->runs[local_4c].length);
    }
    rc_local->n_runs = card;
    *resulttype = '\x01';
  }
  return rc_local;
}

Assistant:

container_t *convert_to_bitset_or_array_container(
    run_container_t *rc, int32_t card,
    uint8_t *resulttype
){
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value <= run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        //run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    //run_container_free(r);
    return answer;
}